

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall Sampling_CatmullRom_Test::TestBody(Sampling_CatmullRom_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  bool bVar4;
  uint uVar5;
  Allocator AVar6;
  byte bVar7;
  char *pcVar8;
  uint64_t oldstate;
  undefined1 *puVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  span<const_float> f;
  span<const_float> x;
  span<const_float> x_00;
  span<float> cdf_00;
  span<const_float> F;
  span<const_float> values_00;
  span<const_float> f_00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  Float local_128;
  float local_124;
  Float dp;
  Float cp;
  AssertHelper local_118;
  AssertionResult gtest_ar;
  size_t local_100;
  size_t local_f8;
  vector<float,_std::allocator<float>_> values;
  vector<float,_std::allocator<float>_> cdf;
  vector<float,_std::allocator<float>_> nodes;
  PiecewiseConstant1D distrib;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  distrib.func.nAlloc._0_4_ = 0x3f800000;
  distrib.func.alloc.memoryResource = (memory_resource *)0x3dcccccd00000000;
  distrib.func.ptr = (float *)0x3f6147ae3ecccccd;
  __l._M_len = 5;
  __l._M_array = (iterator)&distrib;
  std::vector<float,_std::allocator<float>_>::vector(&nodes,__l,(allocator_type *)&gtest_ar);
  distrib.func.nAlloc._0_4_ = 0x40a00000;
  distrib.func.alloc.memoryResource = (memory_resource *)0x40a0000000000000;
  distrib.func.ptr = (float *)0x4120000040000000;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&distrib;
  std::vector<float,_std::allocator<float>_>::vector(&values,__l_00,(allocator_type *)&gtest_ar);
  std::vector<float,_std::allocator<float>_>::vector
            (&cdf,(long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2,(allocator_type *)&distrib);
  x.n = (long)nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start >> 2;
  values_00.n = (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
  cdf_00.n = (long)cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
  x.ptr = nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start;
  cdf_00.ptr = cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
               ._M_start;
  values_00.ptr =
       values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start;
  pbrt::IntegrateCatmullRom(x,values_00,cdf_00);
  local_38 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:753:15)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:753:15)>
             ::_M_manager;
  local_50._M_unused._M_object = &nodes;
  local_50._8_8_ = &values;
  AVar6.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Sample1DFunction
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&gtest_ar,
             (function<float_(float)> *)&local_50,0x2000,0x400,0.0,1.0,AVar6);
  sVar3 = gtest_ar.message_;
  AVar6.memoryResource = pstd::pmr::new_delete_resource();
  f.n = local_f8;
  f.ptr = (float *)sVar3.ptr_;
  pbrt::PiecewiseConstant1D::PiecewiseConstant1D(&distrib,f,0.0,1.0,AVar6);
  (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 0x18))
            ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),gtest_ar.message_.ptr_,
             local_100 << 2,4);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  iVar10 = 100;
  puVar9 = &DAT_5851f42d4c957f2e;
  do {
    uVar5 = (uint)((ulong)puVar9 >> 0x2d) ^ (uint)((ulong)puVar9 >> 0x1b);
    bVar7 = (byte)((ulong)puVar9 >> 0x3b);
    auVar2._8_8_ = in_XMM2_Qb;
    auVar2._0_8_ = in_XMM2_Qa;
    auVar11 = vcvtusi2ss_avx512f(auVar2,uVar5 >> bVar7 | uVar5 << 0x20 - bVar7);
    auVar11 = vminss_avx(ZEXT416((uint)(auVar11._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    x_00.n = (long)nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    F.n = (long)cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
    f_00.n = (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    local_128 = auVar11._0_4_;
    x_00.ptr = nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    F.ptr = cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start;
    f_00.ptr = values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_124 = pbrt::SampleCatmullRom(x_00,f_00,F,local_128,(Float *)0x0,&cp);
    local_128 = pbrt::PiecewiseConstant1D::Sample(&distrib,local_128,&dp,(int *)0x0);
    local_130.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_3f689374bc6a7efa;
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    auVar11 = vandps_avx512vl(ZEXT416((uint)(local_124 - local_128)),auVar11);
    local_118.data_._0_4_ = auVar11._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&gtest_ar,"std::abs(cx - dx)","3e-3",(float *)&local_118,
               (double *)&local_130);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_130.ptr_ + 0x10),"Closed form = ",0xe);
      std::ostream::_M_insert<double>((double)local_124);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_130.ptr_ + 0x10),", distrib = ",0xc);
      std::ostream::_M_insert<double>((double)local_128);
      pcVar8 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x2f9,pcVar8);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if (local_130.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_130.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_130.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_130.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_3f689374bc6a7efa;
    auVar1._8_4_ = 0x7fffffff;
    auVar1._0_8_ = 0x7fffffff7fffffff;
    auVar1._12_4_ = 0x7fffffff;
    auVar11 = vandps_avx512vl(ZEXT416((uint)(cp - dp)),auVar1);
    local_118.data_._0_4_ = auVar11._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&gtest_ar,"std::abs(cp - dp)","3e-3",(float *)&local_118,
               (double *)&local_130);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_130.ptr_ + 0x10),"Closed form PDF = ",0x12);
      std::ostream::_M_insert<double>((double)cp);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_130.ptr_ + 0x10),", distrib PDF = ",0x10);
      std::ostream::_M_insert<double>((double)dp);
      pcVar8 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x2fb,pcVar8);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if (local_130.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_130.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_130.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    puVar9 = (undefined1 *)((long)puVar9 * 0x5851f42d4c957f2d + 1);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  distrib.cdf.nStored = 0;
  (*(distrib.cdf.alloc.memoryResource)->_vptr_memory_resource[3])
            (distrib.cdf.alloc.memoryResource,distrib.cdf.ptr,distrib.cdf.nAlloc << 2,4);
  distrib.func.nStored = 0;
  (*(distrib.func.alloc.memoryResource)->_vptr_memory_resource[3])
            (distrib.func.alloc.memoryResource,distrib.func.ptr,
             CONCAT44(distrib.func.nAlloc._4_4_,(undefined4)distrib.func.nAlloc) << 2,4);
  if (cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)cdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)nodes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Sampling, CatmullRom) {
    std::vector<Float> nodes = {Float(0), Float(.1), Float(.4), Float(.88), Float(1)};
    std::vector<Float> values = {Float(0), Float(5), Float(2), Float(10), Float(5)};
    std::vector<Float> cdf(values.size());

    IntegrateCatmullRom(nodes, values, pstd::span<Float>(cdf));

    auto cr = [&](Float v) { return CatmullRom(nodes, values, v); };
    PiecewiseConstant1D distrib(Sample1DFunction(cr, 8192, 1024, 0.f, 1.f));
    for (Float u : Uniform1D(100)) {
        Float cp;
        Float cx = SampleCatmullRom(nodes, values, cdf, u, nullptr, &cp);

        Float dp;
        Float dx = distrib.Sample(u, &dp);
        EXPECT_LT(std::abs(cx - dx), 3e-3)
            << "Closed form = " << cx << ", distrib = " << dx;
        EXPECT_LT(std::abs(cp - dp), 3e-3)
            << "Closed form PDF = " << cp << ", distrib PDF = " << dp;
    }
}